

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O1

vertex_iterator __thiscall
xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
ObtainVertexFromVertexMap
          (Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>
           *this,StateExample state)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
  _Var3;
  int64_t *piVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  
  uVar1 = (this->vertex_map_)._M_h._M_bucket_count;
  uVar5 = (ulong)state.id % uVar1;
  p_Var6 = (this->vertex_map_)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6,
     p_Var6->_M_nxt[1]._M_nxt != (_Hash_node_base *)state.id)) {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, p_Var2[1]._M_nxt == (_Hash_node_base *)state.id)) goto LAB_00105271;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_00105271:
  if (p_Var7 == (__node_base_ptr)0x0) {
    _Var3._M_cur = (__node_type *)0x0;
  }
  else {
    _Var3._M_cur = (__node_type *)p_Var7->_M_nxt;
  }
  if ((_Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
       )_Var3._M_cur ==
      (_Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
       )0x0) {
    piVar4 = (int64_t *)operator_new(0x70);
    *piVar4 = state.id;
    piVar4[1] = state.id;
    piVar4[4] = (int64_t)(piVar4 + 3);
    piVar4[3] = (int64_t)(piVar4 + 3);
    piVar4[5] = 0;
    piVar4[7] = (int64_t)(piVar4 + 6);
    piVar4[6] = (int64_t)(piVar4 + 6);
    piVar4[8] = 0;
    *(undefined1 *)(piVar4 + 9) = 0;
    *(undefined1 *)((long)piVar4 + 0x49) = 0;
    *(undefined4 *)(piVar4 + 10) = 0xffffffff;
    *(undefined4 *)((long)piVar4 + 0x54) = 0x7fefffff;
    *(undefined4 *)(piVar4 + 0xb) = 0xffffffff;
    *(undefined4 *)((long)piVar4 + 0x5c) = 0x7fefffff;
    piVar4[0xc] = 0x7fefffffffffffff;
    piVar4[0xd] = 0;
    std::
    _Hashtable<long,std::pair<long_const,xmotion::Graph<xmotion::StateExample,double,xmotion::DefaultIndexer<xmotion::StateExample>>::Vertex*>,std::allocator<std::pair<long_const,xmotion::Graph<xmotion::StateExample,double,xmotion::DefaultIndexer<xmotion::StateExample>>::Vertex*>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<long,xmotion::Graph<xmotion::StateExample,double,xmotion::DefaultIndexer<xmotion::StateExample>>::Vertex*>>
              ((_Hashtable<long,std::pair<long_const,xmotion::Graph<xmotion::StateExample,double,xmotion::DefaultIndexer<xmotion::StateExample>>::Vertex*>,std::allocator<std::pair<long_const,xmotion::Graph<xmotion::StateExample,double,xmotion::DefaultIndexer<xmotion::StateExample>>::Vertex*>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->vertex_map_);
    uVar1 = (this->vertex_map_)._M_h._M_bucket_count;
    uVar5 = (ulong)state.id % uVar1;
    p_Var6 = (this->vertex_map_)._M_h._M_buckets[uVar5];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var6 != (__node_base_ptr)0x0) &&
       (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6,
       p_Var6->_M_nxt[1]._M_nxt != (_Hash_node_base *)state.id)) {
      while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar5) ||
           (p_Var7 = p_Var6, p_Var2[1]._M_nxt == (_Hash_node_base *)state.id)) goto LAB_0010534e;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_0010534e:
    if (p_Var7 == (__node_base_ptr)0x0) {
      _Var3._M_cur = (__node_type *)0x0;
    }
    else {
      _Var3._M_cur = (__node_type *)p_Var7->_M_nxt;
    }
  }
  return (vertex_iterator)_Var3._M_cur;
}

Assistant:

typename Graph<State, Transition, StateIndexer>::vertex_iterator
Graph<State, Transition, StateIndexer>::ObtainVertexFromVertexMap(State state) {
  int64_t state_id = GetStateIndex(state);
  auto it = vertex_map_.find(state_id);

  if (it == vertex_map_.end()) {
    auto new_vertex = new Vertex(state, state_id);
    new_vertex->search_parent = vertex_end();
    vertex_map_.insert(std::make_pair(state_id, new_vertex));
    return vertex_iterator(vertex_map_.find(state_id));
  }

  return vertex_iterator(it);
}